

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = ispring::OS::isAdmin();
  if (!bVar1) {
    poVar2 = operator<<((ostream *)&std::cout,(_xout_color)(uchar)ispring::xout._60_4_);
    poVar2 = std::operator<<(poVar2,"cip requires admin privileges to run");
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    init_hasargoption();
    parse_command(argc,argv);
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc,char* argv[]){
    if(!ispring::OS::isAdmin()){
        std::cout << ispring::xout.light_red << "cip requires admin privileges to run" << ispring::xout.white << std::endl;
        return 1;
    }
    init_hasargoption();
	parse_command(argc,argv);
	return 0;
}